

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sx_str_block sx_findblock(char *str,char open,char close)

{
  sx_str_block sVar1;
  char local_29;
  char ch;
  int count;
  char close_local;
  char open_local;
  char *str_local;
  sx_str_block b;
  
  memset(&str_local,0,0x10);
  local_29 = *str;
  _count = str;
  do {
    if (local_29 == '\0') {
LAB_0010bca7:
      sVar1.end = b.start;
      sVar1.start = str_local;
      return sVar1;
    }
    if ((str_local == (char *)0x0) && (local_29 == open)) {
      str_local = _count + 1;
    }
    else if ((str_local != (char *)0x0) && (local_29 == close)) {
      b.start = _count + -1;
      goto LAB_0010bca7;
    }
    local_29 = _count[1];
    _count = _count + 1;
  } while( true );
}

Assistant:

sx_str_block sx_findblock(const char* str, char open, char close)
{
    int count = 0;
    sx_str_block b = { NULL, NULL };

    for (char ch = *str; ch && count >= 0; ch = *++str) {
        if (!b.start && ch == open) {
            b.start = str + 1;
        } else if (b.start && ch == close) {
            b.end = str - 1;
            return b;
        }
    }

    return b;
}